

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

Bool reportCallback(TidyMessage tmessage)

{
  return yes;
}

Assistant:

static Bool TIDY_CALL reportCallback(TidyMessage tmessage)
{
#if 0
    TidyIterator pos;
    TidyMessageArgument arg;
    TidyFormatParameterType messageType;
    ctmbstr messageFormat;

    printf("FILTER: %s, %s\n", tidyGetMessageKey( tmessage ), tidyGetMessageOutput( tmessage ));
    
    /* loop through the arguments, if any, and print their details */
    pos = tidyGetMessageArguments( tmessage );
    while ( pos )
    {
        arg = tidyGetNextMessageArgument( tmessage, &pos );
        messageType = tidyGetArgType( tmessage, &arg );
        messageFormat = tidyGetArgFormat( tmessage, &arg );
        printf( "  Type = %u, Format = %s, Value = ", messageType, messageFormat );
        
        switch (messageType)
        {
            case tidyFormatType_STRING:
                printf("%s\n", tidyGetArgValueString( tmessage, &arg ));
                break;
                
            case tidyFormatType_INT:
                printf("%d\n", tidyGetArgValueInt( tmessage, &arg));
                break;
    
            case tidyFormatType_UINT:
                printf("%u\n", tidyGetArgValueUInt( tmessage, &arg));
                break;

            case tidyFormatType_DOUBLE:
                printf("%g\n", tidyGetArgValueDouble( tmessage, &arg));
                break;

            default:
                printf("%s", "unknown so far\n");
        }
    }

    return no;  /* suppress LibTidy's own output of this message */
#else
    return yes; /* needed so Tidy will not block output of this message */
#endif
}